

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O3

void __thiscall CTPNStmLabel::gen_code(CTPNStmLabel *this,int param_1,int param_2)

{
  CTPNStmEnclosing *pCVar1;
  CTPNStm *substm;
  CTcCodeStream *this_00;
  CTcCodeLabel *lbl;
  
  this_00 = G_cs;
  pCVar1 = G_cs->enclosing_;
  G_cs->enclosing_ = (CTPNStmEnclosing *)this;
  lbl = this->goto_label_;
  if (lbl == (CTcCodeLabel *)0x0) {
    lbl = CTcCodeStream::new_label_fwd(this_00);
    this->goto_label_ = lbl;
  }
  CTcPrsNode::def_label_pos(lbl);
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  substm = (this->super_CTPNStmLabelBase).stm_;
  if (substm != (CTPNStm *)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)this,substm);
  }
  if (this->break_label_ != (CTcCodeLabel *)0x0) {
    CTcPrsNode::def_label_pos(this->break_label_);
  }
  G_cs->enclosing_ = pCVar1;
  return;
}

Assistant:

void CTPNStmLabel::gen_code(int, int)
{
    CTPNStmEnclosing *old_enclosing;

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);
    
    /* 
     *   Define our label position - this is where we come if someone does
     *   a 'goto' to this label.  (Note that we might not have a 'goto'
     *   label defined yet - if we weren't forward-referenced by a 'goto'
     *   statement, we won't have a label defined.  Call get_goto_label()
     *   to ensure we create a label if it doesn't already exist.)
     */
    def_label_pos(get_goto_label());

    /* 
     *   add the source location of the label - this probably will have no
     *   effect, since we don't generate any code for the label itself,
     *   but it's harmless so do it anyway to guard against weird cases 
     */
    add_debug_line_rec();

    /* 
     *   generate code for the labeled statement, discarding any
     *   calculated value
     */
    if (stm_ != 0)
        gen_code_substm(stm_);

    /* 
     *   If we have a 'break' label, it means that code within our labeled
     *   statement (i.e., nested within the label) did a 'break' to leave
     *   the labeled statement.  The target of the break is the next
     *   statement after the labeled statement, which comes next, so
     *   define the label here.  
     */
    if (break_label_ != 0)
        def_label_pos(break_label_);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);
}